

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

upb_MiniTableField * upb_MiniTable_MapValue(upb_MiniTable *m)

{
  int iVar1;
  uint32_t uVar2;
  upb_MiniTableField *f_00;
  upb_MiniTableField *f;
  upb_MiniTable *m_local;
  
  iVar1 = upb_MiniTable_FieldCount(m);
  if (iVar1 != 2) {
    __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                  ,0xa5,
                  "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                 );
  }
  f_00 = upb_MiniTable_GetFieldByIndex(m,1);
  uVar2 = upb_MiniTableField_Number(f_00);
  if (uVar2 == 2) {
    return f_00;
  }
  __assert_fail("upb_MiniTableField_Number(f) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                ,0xa7,
                "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
               );
}

Assistant:

UPB_API_INLINE const struct upb_MiniTableField* upb_MiniTable_MapValue(
    const struct upb_MiniTable* m) {
  UPB_ASSERT(upb_MiniTable_FieldCount(m) == 2);
  const struct upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, 1);
  UPB_ASSERT(upb_MiniTableField_Number(f) == 2);
  return f;
}